

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# faddeeva.c
# Opt level: O3

double erfcx_y100(double y100)

{
  double dVar1;
  
  switch((int)y100) {
  case 0:
    dVar1 = y100 + y100 + -1.0;
    dVar1 = (((((dVar1 * 1.5917038551111112e-15 + 3.688502236043496e-13) * dVar1 +
               8.171066004730779e-11) * dVar1 + 1.7403143962587938e-08) * dVar1 +
             3.5779077297597742e-06) * dVar1 + 0.000712340910470263) * dVar1 + 0.0007087803245410644
    ;
    break;
  case 1:
    dVar1 = y100 + y100 + -3.0;
    dVar1 = (((((dVar1 * 1.6868473576888889e-15 + 3.885203751853429e-13) * dVar1 +
               8.549644929604033e-11) * dVar1 + 1.80718412721492e-08) * dVar1 +
             3.6843175430938994e-06) * dVar1 + 0.0007268640236737999) * dVar1 +
            0.0021479143208285143;
    break;
  case 2:
    dVar1 = y100 + y100 + -5.0;
    dVar1 = (((((dVar1 * 1.787206146488889e-15 + 4.093585851777244e-13) * dVar1 +
               8.948471512241509e-11) * dVar1 + 1.8771627021793087e-08) * dVar1 +
             3.794831995752824e-06) * dVar1 + 0.0007418209232355551) * dVar1 + 0.0036165255935630175
    ;
    break;
  case 3:
    dVar1 = y100 + y100 + -7.0;
    dVar1 = (((((dVar1 * 1.8939926435555556e-15 + 4.3143925959079665e-13) * dVar1 +
               9.3687503063179e-11) * dVar1 + 1.950416870430047e-08) * dVar1 + 3.90964257267357e-06)
             * dVar1 + 0.0007572284073479166) * dVar1 + 0.005115498386003198;
    break;
  case 4:
    dVar1 = y100 + y100 + -9.0;
    dVar1 = (((((dVar1 * 2.007635221333333e-15 + 4.548420740601775e-13) * dVar1 +
               9.81176313217091e-11) * dVar1 + 2.0271233238288382e-08) * dVar1 +
             4.028951058939944e-06) * dVar1 + 0.0007731040605444745) * dVar1 + 0.006645751317267305;
    break;
  case 5:
    dVar1 = y100 + y100 + -11.0;
    dVar1 = (((((dVar1 * 2.1285907413333335e-15 + 4.796520139061334e-13) * dVar1 +
               1.0278874108587318e-10) * dVar1 + 2.1074693344544657e-08) * dVar1 +
             4.152970155262265e-06) * dVar1 + 0.0007894662961188171) * dVar1 + 0.008208238997024121;
    break;
  case 6:
    dVar1 = y100 + y100 + -13.0;
    dVar1 = (((((dVar1 * 2.2573462684444446e-15 + 5.059597262369282e-13) * dVar1 +
               1.0771535136565471e-10) * dVar1 + 2.1916534346907168e-08) * dVar1 +
             4.281924132973699e-06) * dVar1 + 0.0008063344010834284) * dVar1 + 0.009803953727535219;
    break;
  case 7:
    dVar1 = y100 + y100 + -15.0;
    dVar1 = (((((dVar1 * 2.3944209546666666e-15 + 5.338618936581688e-13) * dVar1 +
               1.129129174587924e-10) * dVar1 + 2.2798861426211987e-08) * dVar1 +
             4.416049531176544e-06) * dVar1 + 0.0008237285838319657) * dVar1 + 0.011433927298290302;
    break;
  case 8:
    dVar1 = y100 + y100 + -17.0;
    dVar1 = (((((dVar1 * 2.5403679644444446e-15 + 5.634616306755024e-13) * dVar1 +
               1.1839789326602696e-10) * dVar1 + 2.3723907357214174e-08) * dVar1 +
             4.555595898845751e-06) * dVar1 + 0.0008416700246790696) * dVar1 + 0.013099232878814654;
    break;
  case 9:
    dVar1 = y100 + y100 + -19.0;
    dVar1 = (((((dVar1 * 2.695776456888889e-15 + 5.948689037032026e-13) * dVar1 +
               1.2418779768752298e-10) * dVar1 + 2.4694040760197315e-08) * dVar1 +
             4.700826584881687e-06) * dVar1 + 0.0008601809294634594) * dVar1 + 0.014800987015587536;
    break;
  case 10:
    dVar1 = y100 + y100 + -21.0;
    dVar1 = (((((dVar1 * 2.8612737351111112e-15 + 6.282009758687478e-13) * dVar1 +
               1.3030128534230821e-10) * dVar1 + 2.571177490088171e-08) * dVar1 +
             4.852019579300175e-06) * dVar1 + 0.0008792845864124146) * dVar1 + 0.01654035173939407;
    break;
  case 0xb:
    dVar1 = y100 + y100 + -23.0;
    dVar1 = (((((dVar1 * 3.0375273884444443e-15 + 6.635828774535271e-13) * dVar1 +
               1.3675822186304616e-10) * dVar1 + 2.677977707421807e-08) * dVar1 +
             5.009468408955337e-06) * dVar1 + 0.0008990054264789172) * dVar1 + 0.018318536789842393;
    break;
  case 0xc:
    dVar1 = y100 + y100 + -25.0;
    dVar1 = (((((dVar1 * 3.2252476e-15 + 7.011479031104373e-13) * dVar1 + 1.435797640280904e-10) *
               dVar1 + 2.7900878609710433e-08) * dVar1 + 5.1734830914104276e-06) * dVar1 +
            0.0009193690873767368) * dVar1 + 0.020136801964214277;
    break;
  case 0xd:
    dVar1 = y100 + y100 + -27.0;
    dVar1 = (((((dVar1 * 3.425189232e-15 + 7.41038136474992e-13) * dVar1 + 1.507884450032973e-10) *
               dVar1 + 2.9078085538049375e-08) * dVar1 + 5.344391150804117e-06) * dVar1 +
            0.0009404024815536678) * dVar1 + 0.021996459598282742;
    break;
  case 0xe:
    dVar1 = y100 + y100 + -29.0;
    dVar1 = (((((dVar1 * 3.6381553564444445e-15 + 7.834050047241445e-13) * dVar1 +
               1.5840826497296334e-10) * dVar1 + 3.0314589961047687e-08) * dVar1 +
             5.5225386998049015e-06) * dVar1 + 0.0009621338683590018) * dVar1 + 0.02389887718722632;
    break;
  case 0xf:
    dVar1 = y100 + y100 + -31.0;
    dVar1 = (((((dVar1 * 3.864997576888889e-15 + 8.28409859287854e-13) * dVar1 +
               1.664647874552963e-10) * dVar1 + 3.161378216916483e-08) * dVar1 +
             5.708291592005185e-06) * dVar1 + 0.0009845929306782012) * dVar1 + 0.025845480155298518;
    break;
  case 0x10:
    dVar1 = y100 + y100 + -33.0;
    dVar1 = (((((dVar1 * 4.106620648888889e-15 + 8.762245912484253e-13) * dVar1 +
               1.7498524159268457e-10) * dVar1 + 3.297926355324652e-08) * dVar1 +
             5.9020366493792216e-06) * dVar1 + 0.0010078108563256892) * dVar1 + 0.027837754783474698
    ;
    break;
  case 0x11:
    dVar1 = y100 + y100 + -35.0;
    dVar1 = (((((dVar1 * 4.3639844053333335e-15 + 9.270322736636504e-13) * dVar1 +
               1.839986307293409e-10) * dVar1 + 3.441486035954272e-08) * dVar1 +
             6.104182969716206e-06) * dVar1 + 0.001031820424505735) * dVar1 + 0.029877251304899308;
    break;
  case 0x12:
    dVar1 = y100 + y100 + -37.0;
    dVar1 = (((((dVar1 * 4.6381060817777776e-15 + 9.810278385988926e-13) * dVar1 +
               1.9353584758781173e-10) * dVar1 + 3.592463833952192e-08) * dVar1 +
             6.315163319241458e-06) * dVar1 + 0.0010566560976716574) * dVar1 + 0.03196558717859645;
    break;
  case 0x13:
    dVar1 = y100 + y100 + -39.0;
    dVar1 = (((((dVar1 * 4.930062526222222e-15 + 1.0384187833037281e-12) * dVar1 +
               2.0362979635817883e-10) * dVar1 + 3.7512918348533524e-08) * dVar1 +
             6.535435615955393e-06) * dVar1 + 0.0010823541191350532) * dVar1 + 0.03410445055258834;
    break;
  case 0x14:
    dVar1 = y100 + y100 + -41.0;
    dVar1 = (((((dVar1 * 5.240994910222222e-15 + 1.0994259106646732e-12) * dVar1 +
               2.1431552202133775e-10) * dVar1 + 3.918429294991359e-08) * dVar1 +
             6.765484509551836e-06) * dVar1 + 0.0011089526167995269) * dVar1 + 0.036295603928292425;
    break;
  case 0x15:
    dVar1 = y100 + y100 + -43.0;
    dVar1 = (((((dVar1 * 5.572109287111111e-15 + 1.1642841011361993e-12) * dVar1 +
               2.2563034723692883e-10) * dVar1 + 4.0943644083718584e-08) * dVar1 +
             7.005823064124631e-06) * dVar1 + 0.001136491713417542) * dVar1 + 0.03854088803884051;
    break;
  case 0x16:
    dVar1 = y100 + y100 + -45.0;
    dVar1 = (((((dVar1 * 5.924680236444444e-15 + 1.2332431172381557e-12) * dVar1 +
               2.3761401711005023e-10) * dVar1 + 4.279616186185504e-08) * dVar1 +
             7.2569945502343e-06) * dVar1 + 0.0011650136437945675) * dVar1 + 0.04084222595478596;
    break;
  case 0x17:
    dVar1 = y100 + y100 + -47.0;
    dVar1 = (((((dVar1 * 6.300053285333334e-15 + 1.3065684400300477e-12) * dVar1 +
               2.503088521647295e-10) * dVar1 + 4.474736455396099e-08) * dVar1 +
             7.51957435328492e-06) * dVar1 + 0.0011945628793917271) * dVar1 + 0.04320162743154022;
    break;
  case 0x18:
    dVar1 = y100 + y100 + -49.0;
    dVar1 = (((((dVar1 * 6.6996477404444446e-15 + 1.384542137097712e-12) * dVar1 +
               2.6375990983978426e-10) * dVar1 + 4.680311983095446e-08) * dVar1 +
             7.794172005555192e-06) * dVar1 + 0.001225186260806753) * dVar1 + 0.04562119351381047;
    break;
  case 0x19:
    dVar1 = y100 + y100 + -51.0;
    dVar1 = (((((dVar1 * 7.124958935111111e-15 + 1.4674637611609885e-12) * dVar1 +
               2.7801515481905746e-10) * dVar1 + 4.896966733568202e-08) * dVar1 +
             8.081433349636768e-06) * dVar1 + 0.0012569331386432195) * dVar1 + 0.048103121413299865;
    break;
  case 0x1a:
    dVar1 = y100 + y100 + -53.0;
    dVar1 = (((((dVar1 * 7.577560782222223e-15 + 1.5556512782814827e-12) * dVar1 +
               2.9312563849675507e-10) * dVar1 + 5.125364265255184e-08) * dVar1 +
             8.38204284145688e-06) * dVar1 + 0.0012898555233099055) * dVar1 + 0.05064970967698334;
    break;
  case 0x1b:
    dVar1 = y100 + y100 + -55.0;
    dVar1 = (((((dVar1 * 8.059107964444444e-15 + 1.6494420240828494e-12) * dVar1 +
               3.09145687866348e-10) * dVar1 + 5.36621027503968e-08) * dVar1 + 8.696726001500767e-06
             ) * dVar1 + 0.0013240082443256975) * dVar1 + 0.053263363664388864;
    break;
  case 0x1c:
    dVar1 = y100 + y100 + -57.0;
    dVar1 = (((((dVar1 * 8.571338168888888e-15 + 1.7491936862246368e-12) * dVar1 +
               3.261331041050314e-10) * dVar1 + 5.6202552975056696e-08) * dVar1 +
             9.026252023301638e-06) * dVar1 + 0.001359449119740819) * dVar1 + 0.05594660135350001;
    break;
  case 0x1d:
    dVar1 = y100 + y100 + -59.0;
    dVar1 = (((((dVar1 * 9.11607367111111e-15 + 1.855285310975186e-12) * dVar1 +
               3.4414937110591756e-10) * dVar1 + 5.8882975670265285e-08) * dVar1 +
             9.371436548731279e-06) * dVar1 + 0.0013962391363223647) * dVar1 + 0.058702059496154084;
    break;
  case 0x1e:
    dVar1 = y100 + y100 + -61.0;
    dVar1 = (((((dVar1 * 9.69522384e-15 + 1.9681183310134517e-12) * dVar1 + 3.63259874182953e-10) *
               dVar1 + 6.171186050734718e-08) * dVar1 + 9.733144620101681e-06) * dVar1 +
            0.0014344426411912014) * dVar1 + 0.061532500145144775;
    break;
  case 0x1f:
    dVar1 = y100 + y100 + -63.0;
    dVar1 = (((((dVar1 * 1.031078448e-14 + 2.088117611438512e-12) * dVar1 + 3.8353412915303665e-10)
               * dVar1 + 6.469823660593325e-08) * dVar1 + 1.0112293819576438e-05) * dVar1 +
            0.0014741275456383132) * dVar1 + 0.06444081757665329;
    break;
  case 0x20:
    dVar1 = y100 + y100 + -65.0;
    dVar1 = (((((dVar1 * 1.0964842115555555e-14 + 2.2157325110542536e-12) * dVar1 +
               4.050460219481114e-10) * dVar1 + 6.785170652936334e-08) * dVar1 +
             1.0509857606888329e-05) * dVar1 + 0.001515365541891654) * dVar1 + 0.06743004563313039;
    break;
  case 0x21:
    dVar1 = y100 + y100 + -67.0;
    dVar1 = (((((dVar1 * 1.1659571751111111e-14 + 2.351437952227442e-12) * dVar1 +
               4.2787405890153386e-10) * dVar1 + 7.118248223961351e-08) * dVar1 +
             1.092686886686523e-05) * dVar1 + 0.001558232333649571) * dVar1 + 0.07050336551333886;
    break;
  case 0x22:
    dVar1 = y100 + y100 + -69.0;
    dVar1 = (((((dVar1 * 1.2397238257777777e-14 + 2.495735500408857e-12) * dVar1 +
               4.521016277747649e-10) * dVar1 + 7.470142309742318e-08) * dVar1 +
             1.1364423678778208e-05) * dVar1 + 0.001602807881243882) * dVar1 + 0.0736641140379446;
    break;
  case 0x23:
    dVar1 = y100 + y100 + -71.0;
    dVar1 = (((((dVar1 * 1.3180196462222222e-14 + 2.6491544403815725e-12) * dVar1 +
               4.778172695691648e-10) * dVar1 + 7.842007599378154e-08) * dVar1 +
             1.1823685320041301e-05) * dVar1 + 0.0016491766623447889) * dVar1 + 0.07691579242081956;
    break;
  case 0x24:
    dVar1 = y100 + y100 + -73.0;
    dVar1 = (((((dVar1 * 1.4010889635555555e-14 + 2.81225284976269e-12) * dVar1 +
               5.051149610985711e-10) * dVar1 + 8.235071769897904e-08) * dVar1 +
             1.2305888517309891e-05) * dVar1 + 0.0016974279491709504) * dVar1 + 0.08026207557809462;
    break;
  case 0x25:
    dVar1 = y100 + y100 + -75.0;
    dVar1 = (((((dVar1 * 1.489185159111111e-14 + 2.9856186620887555e-12) * dVar1 +
               5.340944082386946e-10) * dVar1 + 8.650639951503644e-08) * dVar1 +
             1.2812343958540764e-05) * dVar1 + 0.0017476561032212657) * dVar1 + 0.08370682200898036;
    break;
  case 0x26:
    dVar1 = y100 + y100 + -77.0;
    dVar1 = (((((dVar1 * 1.5825697795555556e-14 + 3.169870708003396e-12) * dVar1 +
               5.648613497261646e-10) * dVar1 + 9.0900994316429e-08) * dVar1 +
             1.3344443080089493e-05) * dVar1 + 0.0017999608886001962) * dVar1 + 0.08725408428446171;
    break;
  case 0x27:
    dVar1 = y100 + y100 + -79.0;
    dVar1 = (((((dVar1 * 1.6815130613333334e-14 + 3.36565973660991e-12) * dVar1 +
               5.975278712524205e-10) * dVar1 + 9.554924606254991e-08) * dVar1 +
             1.390366314342612e-05) * dVar1 + 0.00185444780506577) * dVar1 + 0.09090812018217274;
    break;
  case 0x28:
    dVar1 = y100 + y100 + -81.0;
    dVar1 = (((((dVar1 * 1.786293159111111e-14 + 3.573669397558913e-12) * dVar1 +
               6.3221272959791e-10) * dVar1 + 1.0046682186333614e-07) * dVar1 +
             1.4491572616545005e-05) * dVar1 + 0.0019112284419887304) * dVar1 + 0.09467340450807549;
    break;
  case 0x29:
    dVar1 = y100 + y100 + -83.0;
    dVar1 = (((((dVar1 * 1.897195904e-14 + 3.794617185082434e-12) * dVar1 + 6.690416864001935e-10) *
               dVar1 + 1.0567036667675984e-07) * dVar1 + 1.5109836875625445e-05) * dVar1 +
            0.0019704208544725622) * dVar1 + 0.09855464164800445;
    break;
  case 0x2a:
    dVar1 = y100 + y100 + -85.0;
    dVar1 = (((((dVar1 * 2.0145143075555556e-14 + 4.029255327663256e-12) * dVar1 +
               7.081478511009766e-10) * dVar1 + 1.1117756071353507e-07) * dVar1 +
             1.576022424296218e-05) * dVar1 + 0.0020321499629472857) * dVar1 + 0.1025567788947009;
    break;
  case 0x2b:
    dVar1 = y100 + y100 + -87.0;
    dVar1 = (((((dVar1 * 2.138547936e-14 + 4.2783716186085925e-12) * dVar1 + 7.496720325093842e-10)
               * dVar1 + 1.1700717962026153e-07) * dVar1 + 1.6444612377624982e-05) * dVar1 +
            0.002096547977614873) * dVar1 + 0.10668502059865094;
    break;
  case 0x2c:
    dVar1 = y100 + y100 + -89.0;
    dVar1 = (((((dVar1 * 2.2696025653333333e-14 + 4.542790176310636e-12) * dVar1 +
               7.937630983149963e-10) * dVar1 + 1.2317915750735938e-07) * dVar1 +
             1.7164995035719656e-05) * dVar1 + 0.002163754849190817) * dVar1 + 0.11094484319386444;
    break;
  case 0x2d:
    dVar1 = y100 + y100 + -91.0;
    dVar1 = (((((dVar1 * 2.4079890062222222e-14 + 4.8233721206418025e-12) * dVar1 +
               8.405783418038907e-10) * dVar1 + 1.2971465288245997e-07) * dVar1 +
             1.7923489217504226e-05) * dVar1 + 0.002233918747454642) * dVar1 + 0.11534201115268805;
    break;
  case 0x2e:
    dVar1 = y100 + y100 + -93.0;
    dVar1 = (((((dVar1 * 2.554022711111111e-14 + 5.121016156922585e-12) * dVar1 +
               8.902838548849328e-10) * dVar1 + 1.3663611754337958e-07) * dVar1 +
             1.8722342718958937e-05) * dVar1 + 0.002307196569191869) * dVar1 + 0.11988259392684095;
    break;
  case 0x2f:
    dVar1 = y100 + y100 + -95.0;
    dVar1 = (((((dVar1 * 2.708022592e-14 + 5.436659058313422e-12) * dVar1 + 9.430549064645925e-10) *
               dVar1 + 1.439673684773947e-07) * dVar1 + 1.956394210571161e-05) * dVar1 +
            0.0023837544771809576) * dVar1 + 0.12457298393509812;
    break;
  case 0x30:
    dVar1 = y100 + y100 + -97.0;
    dVar1 = (((((dVar1 * 2.8703099555555555e-14 + 5.771276031135163e-12) * dVar1 +
               9.990763250638903e-10) * dVar1 + 1.5173366280523906e-07) * dVar1 +
             2.045082112747588e-05) * dVar1 + 0.002463768471950886) * dVar1 + 0.12941991566142438;
    break;
  case 0x31:
    dVar1 = y100 + y100 + -99.0;
    dVar1 = (((((dVar1 * 3.041208014222222e-14 + 6.125880953678788e-12) * dVar1 +
               1.0585428844575133e-09) * dVar1 + 1.5996177579900442e-07) * dVar1 +
             2.1385669591362916e-05) * dVar1 + 0.0025474249981080823) * dVar1 + 0.13443048593088697;
    break;
  case 0x32:
    dVar1 = y100 + y100 + -101.0;
    dVar1 = (((((dVar1 * 3.221039450666667e-14 + 6.501526475309089e-12) * dVar1 +
               1.1216596910444997e-09) * dVar1 + 1.6868008199296823e-07) * dVar1 +
             2.2371342712572568e-05) * dVar1 + 0.0026349215871051762) * dVar1 + 0.13961217543434562;
    break;
  case 0x33:
    dVar1 = y100 + y100 + -103.0;
    dVar1 = (((((dVar1 * 3.4101266222222225e-14 + 6.8993039665054284e-12) * dVar1 +
               1.1886425714330958e-09) * dVar1 + 1.7791863939526378e-07) * dVar1 +
             2.341087096105095e-05) * dVar1 + 0.002726467538398244) * dVar1 + 0.144972871576738;
    break;
  case 0x34:
    dVar1 = y100 + y100 + -105.0;
    dVar1 = (((((dVar1 * 3.6087889048888887e-14 + 7.320343304922983e-12) * dVar1 +
               1.259718458758337e-09) * dVar1 + 1.8770927679626137e-07) * dVar1 +
             2.4507470422713398e-05) * dVar1 + 0.0028222846410136237) * dVar1 + 0.15052089272774619;
    break;
  case 0x35:
    dVar1 = y100 + y100 + -107.0;
    dVar1 = (((((dVar1 * 3.817342003555556e-14 + 7.765812489104676e-12) * dVar1 +
               1.3351257759815557e-09) * dVar1 + 1.9808568415654462e-07) * dVar1 +
             2.566455369376845e-05) * dVar1 + 0.0029226079376196627) * dVar1 + 0.1562650139577461;
    break;
  case 0x36:
    dVar1 = y100 + y100 + -109.0;
    dVar1 = (((((dVar1 * 4.036095745777778e-14 + 8.236917066597432e-12) * dVar1 +
               1.415114814424073e-09) * dVar1 + 2.0908350604346383e-07) * dVar1 +
             2.6885741326534563e-05) * dVar1 + 0.0030276865332726477) * dVar1 + 0.16221449434620738;
    break;
  case 0x37:
    dVar1 = y100 + y100 + -111.0;
    dVar1 = (((((dVar1 * 4.265352897777778e-14 + 8.734899366193081e-12) * dVar1 +
               1.499948105599609e-09) * dVar1 + 2.2074043807045782e-07) * dVar1 +
             2.8174873844911173e-05) * dVar1 + 0.0031377844510793083) * dVar1 + 0.1683791059541213;
    break;
  case 0x38:
    dVar1 = y100 + y100 + -113.0;
    dVar1 = (((((dVar1 * 4.5054073102222224e-14 + 9.261037523542736e-12) * dVar1 +
               1.5899007843582445e-09) * dVar1 + 2.3309632627767074e-07) * dVar1 +
             2.9536024347344365e-05) * dVar1 + 0.0032531815370903066) * dVar1 + 0.1747691645565937;
    break;
  case 0x39:
    dVar1 = y100 + y100 + -115.0;
    dVar1 = (((((dVar1 * 4.756541809777778e-14 + 9.81664429428549e-12) * dVar1 +
               1.6852609412267751e-09) * dVar1 + 2.461932693759229e-07) * dVar1 +
             3.09735117147095e-05) * dVar1 + 0.0033741744168097) * dVar1 + 0.18139556223643702;
    break;
  case 0x3a:
    dVar1 = y100 + y100 + -117.0;
    dVar1 = (((((dVar1 * 5.019026583111111e-14 + 1.0403065638343878e-11) * dVar1 +
               1.7863299617388377e-09) * dVar1 + 2.600757237588632e-07) * dVar1 +
             3.249191444001427e-05) * dVar1 + 0.0035010775057740316) * dVar1 + 0.18826980194443665;
    break;
  case 0x3b:
    dVar1 = y100 + y100 + -119.0;
    dVar1 = (((((dVar1 * 5.293117173333333e-14 + 1.1021679075323599e-11) * dVar1 +
               1.8934228504790033e-09) * dVar1 + 2.7479061117017636e-07) * dVar1 +
             3.4096085096200906e-05) * dVar1 + 0.0036342240767211326) * dVar1 + 0.19540403413693969;
    break;
  case 0x3c:
    dVar1 = y100 + y100 + -121.0;
    dVar1 = (((((dVar1 * 5.5790523093333335e-14 + 1.1673891799578381e-11) * dVar1 +
               2.0068685374849e-09) * dVar1 + 2.9038742889416174e-07) * dVar1 +
             3.579116545759241e-05) * dVar1 + 0.00377396738593236) * dVar1 + 0.20281109560651886;
    break;
  case 0x3d:
    dVar1 = y100 + y100 + -123.0;
    dVar1 = (((((dVar1 * 5.877052016e-14 + 1.2361138551062899e-11) * dVar1 + 2.1270101645763676e-09)
               * dVar1 + 3.0691836231886877e-07) * dVar1 + 3.7582602289680105e-05) * dVar1 +
            0.003920681861392565) * dVar1 + 0.21050455062669335;
    break;
  case 0x3e:
    dVar1 = y100 + y100 + -125.0;
    dVar1 = (((((dVar1 * 6.187315326222222e-14 + 1.3084879235290859e-11) * dVar1 +
               2.254205349151868e-09) * dVar1 + 3.244383997013992e-07) * dVar1 +
             3.947616382098671e-05) * dVar1 + 0.004074764355468959) * dVar1 + 0.21849873453703333;
    break;
  case 0x3f:
    dVar1 = y100 + y100 + -127.0;
    dVar1 = (((((dVar1 * 6.510018375111112e-14 + 1.3846596292818514e-11) * dVar1 +
               2.3888264229264067e-09) * dVar1 + 3.430054489450281e-07) * dVar1 +
             4.1477956909656896e-05) * dVar1 + 0.004236635464862852) * dVar1 + 0.2268087999004323;
    break;
  case 0x40:
    dVar1 = y100 + y100 + -129.0;
    dVar1 = (((((dVar1 * 6.845312263111111e-14 + 1.4647791812837902e-11) * dVar1 +
               2.53126064308532e-09) * dVar1 + 3.6268045617760415e-07) * dVar1 +
             4.35944449162247e-05) * dVar1 + 0.004406740920636517) * dVar1 + 0.23545076536988704;
    break;
  case 0x41:
    dVar1 = y100 + y100 + -131.0;
    dVar1 = (((((dVar1 * 7.193320636444444e-14 + 1.5489984390884758e-11) * dVar1 +
               2.6819103733055602e-09) * dVar1 + 3.835275259003303e-07) * dVar1 +
             4.5832466292683086e-05) * dVar1 + 0.004585553051160578) * dVar1 + 0.24444156740777434;
    break;
  case 0x42:
    dVar1 = y100 + y100 + -133.0;
    dVar1 = (((((dVar1 * 7.554137982222222e-14 + 1.637470573645832e-11) * dVar1 +
               2.8411932320871164e-09) * dVar1 + 4.0561404245564733e-07) * dVar1 +
             4.8199253896534185e-05) * dVar1 + 0.004773572320865003) * dVar1 + 0.25379911500634267;
    break;
  case 0x43:
    dVar1 = y100 + y100 + -135.0;
    dVar1 = (((((dVar1 * 7.927827336888888e-14 + 1.730349702534734e-11) * dVar1 +
               3.009542205890048e-09) * dVar1 + 4.2901079254268185e-07) * dVar1 +
             5.070245503693037e-05) * dVar1 + 0.0049713289477083785) * dVar1 + 0.26354234756393613;
    break;
  case 0x44:
    dVar1 = y100 + y100 + -137.0;
    dVar1 = (((((dVar1 * 8.314418236444444e-14 + 1.827790501024511e-11) * dVar1 +
               3.187405724581438e-09) * dVar1 + 4.537920884886502e-07) * dVar1 +
             5.33501522583266e-05) * dVar1 + 0.005179384602305264) * dVar1 + 0.27369129607732345;
    break;
  case 0x45:
    dVar1 = y100 + y100 + -139.0;
    dVar1 = (((((dVar1 * 8.713904913777777e-14 + 1.9299477888083468e-11) * dVar1 +
               3.3752476967570798e-09) * dVar1 + 4.800358919649474e-07) * dVar1 +
             5.615088486525581e-05) * dVar1 + 0.005398334191669514) * dVar1 + 0.28426714781640317;
    break;
  case 0x46:
    dVar1 = y100 + y100 + -141.0;
    dVar1 = (((((dVar1 * 9.126244261333333e-14 + 2.036976093701707e-11) * dVar1 +
               3.5735475025851714e-09) * dVar1 + 5.078239378174484e-07) * dVar1 +
             5.911367118991331e-05) * dVar1 + 0.0056288077305420795) * dVar1 + 0.2952923146534852;
    break;
  case 0x47:
    dVar1 = y100 + y100 + -143.0;
    dVar1 = (((((dVar1 * 9.551353918222223e-14 + 2.149029193044454e-11) * dVar1 +
               3.782799941896024e-09) * dVar1 + 5.372418576620094e-07) * dVar1 +
             6.224803160219768e-05) * dVar1 + 0.00587147230327454) * dVar1 + 0.3067905052252884;
    break;
  case 0x48:
    dVar1 = y100 + y100 + -145.0;
    dVar1 = (((((dVar1 * 9.989110976e-14 + 2.2662596341239295e-11) * dVar1 + 4.003515135339238e-09)
               * dVar1 + 5.683793028783774e-07) * dVar1 + 6.556401225970764e-05) * dVar1 +
            0.00612703411923391) * dVar1 + 0.3187868011117332;
    break;
  case 0x49:
    dVar1 = y100 + y100 + -147.0;
    dVar1 = (((((dVar1 * 1.0439349811555555e-13 + 2.3888182347073697e-11) * dVar1 +
               4.236218376588347e-09) * dVar1 + 6.013300666188594e-07) * dVar1 +
             6.90722095929424e-05) * dVar1 + 0.006396240664679808) * dVar1 + 0.33130773722152623;
    break;
  case 0x4a:
    dVar1 = y100 + y100 + -149.0;
    dVar1 = (((((dVar1 * 1.0901861383111111e-13 + 2.5168535651285476e-11) * dVar1 +
               4.481449933651445e-09) * dVar1 + 6.36192204432288e-07) * dVar1 +
             7.278379551860356e-05) * dVar1 + 0.0066798829540414) * dVar1 + 0.34438138658041334;
    break;
  case 0x4b:
    dVar1 = y100 + y100 + -151.0;
    dVar1 = (((((dVar1 * 1.1376390933333332e-13 + 2.650511414114305e-11) * dVar1 +
               4.739764797584523e-09) * dVar1 + 6.730681530891739e-07) * dVar1 +
             7.671054337145482e-05) * dVar1 + 0.006978797883488269) * dVar1 + 0.35803744972380175;
    break;
  case 0x4c:
    dVar1 = y100 + y100 + -153.0;
    dVar1 = (((((dVar1 * 1.1862637614222222e-13 + 2.7899342394100073e-11) * dVar1 +
               5.0117323769745884e-09) * dVar1 + 7.120648471806269e-07) * dVar1 +
             8.086485454267072e-05) * dVar1 + 0.007293870689646138) * dVar1 + 0.37230734890119727;
    break;
  case 0x4d:
    dVar1 = y100 + y100 + -155.0;
    dVar1 = (((((dVar1 * 1.2360253370666666e-13 + 2.935260605416409e-11) * dVar1 +
               5.297936136838812e-09) * dVar1 + 7.532938330517133e-07) * dVar1 +
             8.525978581000461e-05) * dVar1 + 0.00762603751625498) * dVar1 + 0.3872243273055545;
    break;
  case 0x4e:
    dVar1 = y100 + y100 + -157.0;
    dVar1 = (((((dVar1 * 1.2868841946666668e-13 + 3.0866246101464866e-11) * dVar1 +
               5.5989731807360405e-09) * dVar1 + 7.968713796195619e-07) * dVar1 +
             8.990907734243825e-05) * dVar1 + 0.007976288091502973) * dVar1 + 0.4028235535461694;
    break;
  case 0x4f:
    dVar1 = y100 + y100 + -159.0;
    dVar1 = (((((dVar1 * 1.338795794311111e-13 + 3.244155303434747e-11) * dVar1 +
               5.915453775108349e-09) * dVar1 + 8.429185856178314e-07) * dVar1 +
             9.482718135925016e-05) * dVar1 + 0.008345668518695046) * dVar1 + 0.4191422315891379;
    break;
  case 0x50:
    dVar1 = y100 + y100 + -161.0;
    dVar1 = (((((dVar1 * 1.3917107176888888e-13 + 3.407976098345888e-11) * dVar1 +
               6.24800081507886e-09) * dVar1 + 8.915614828021988e-07) * dVar1 + 0.000100029291420668
             ) * dVar1 + 0.00873528418282895) * dVar1 + 0.43621971639463786;
    break;
  case 0x51:
    dVar1 = y100 + y100 + -163.0;
    dVar1 = (((((dVar1 * 1.4455745872e-13 + 3.5782041795476564e-11) * dVar1 + 6.597249231221996e-09)
               * dVar1 + 9.429311346463863e-07) * dVar1 + 0.00010553137232446167) * dVar1 +
            0.009146302775554824) * dVar1 + 0.4540976354853433;
    break;
  case 0x52:
    dVar1 = y100 + y100 + -165.0;
    dVar1 = (((((dVar1 * 1.500328071288889e-13 + 3.7549499088161346e-11) * dVar1 +
               6.963845336995697e-09) * dVar1 + 9.971637300550903e-07) * dVar1 +
             0.00011135019058000067) * dVar1 + 0.009579957440886046) * dVar1 + 0.4728200166851233;
    break;
  case 0x53:
    dVar1 = y100 + y100 + -167.0;
    dVar1 = (((((dVar1 * 1.5559069118222223e-13 + 3.938316232643575e-11) * dVar1 +
               7.348446116824222e-09) * dVar1 + 1.0544006716188967e-06) * dVar1 +
             0.00011750334542845235) * dVar1 + 0.010037550043909497) * dVar1 + 0.4924334222717984;
    break;
  case 0x54:
    dVar1 = y100 + y100 + -169.0;
    dVar1 = (((((dVar1 * 1.612241968e-13 + 4.1283980931872625e-11) * dVar1 + 7.75171845505687e-09) *
               dVar1 + 1.1147886579371265e-06) * dVar1 + 0.00012400930037494997) * dVar1 +
            0.010520454564612427) * dVar1 + 0.5129870897920926;
    break;
  case 0x55:
    dVar1 = y100 + y100 + -171.0;
    dVar1 = (((((dVar1 * 1.669259264e-13 + 4.3252818449517084e-11) * dVar1 + 8.174338306304482e-09)
               * dVar1 + 1.1784797595374515e-06) * dVar1 + 0.0001308874151957227) * dVar1 +
            0.011030120618800727) * dVar1 + 0.5345330797910137;
    break;
  case 0x56:
    dVar1 = y100 + y100 + -173.0;
    dVar1 = (((((dVar1 * 1.7268801084444443e-13 + 4.529044681153965e-11) * dVar1 +
               8.616989807896932e-09) * dVar1 + 1.2456314879260905e-06) * dVar1 +
             0.00013815797838036652) * dVar1 + 0.011568077107929736) * dVar1 + 0.557126430711693;
    break;
  case 0x57:
    dVar1 = y100 + y100 + -175.0;
    dVar1 = (((((dVar1 * 1.785021160888889e-13 + 4.739754071312462e-11) * dVar1 +
               9.080364335510602e-09) * dVar1 + 1.316406857309571e-06) * dVar1 +
             0.0001458422399666584) * dVar1 + 0.012135935999503878) * dVar1 + 0.5808253212251933;
    break;
  case 0x58:
    dVar1 = y100 + y100 + -177.0;
    dVar1 = (((((dVar1 * 1.8435945564444444e-13 + 4.957467212766904e-11) * dVar1 +
               9.565159503230623e-09) * dVar1 + 1.3909744385382817e-06) * dVar1 +
             0.00015396244472258864) * dVar1 + 0.01273539623952555) * dVar1 + 0.6056912402529337;
    break;
  case 0x59:
    dVar1 = y100 + y100 + -179.0;
    dVar1 = (((((dVar1 * 1.9025081422222223e-13 + 5.182230499568071e-11) * dVar1 +
               1.0072078109604152e-08) * dVar1 + 1.4695084048334055e-06) * dVar1 +
             0.00016254186562762076) * dVar1 + 0.013368247798287032) * dVar1 + 0.6317891649471572;
    break;
  case 0x5a:
    dVar1 = y100 + y100 + -181.0;
    dVar1 = (((((dVar1 * 1.9616655146666667e-13 + 5.414079010583752e-11) * dVar1 +
               1.060182703153528e-08) * dVar1 + 1.5521885688723188e-06) * dVar1 +
             0.00017160483760259707) * dVar1 + 0.014036375850601992) * dVar1 + 0.6591877468972532;
    break;
  case 0x5b:
    dVar1 = y100 + y100 + -183.0;
    dVar1 = (((((dVar1 * 2.0209663662222222e-13 + 5.653036019492569e-11) * dVar1 +
               1.1155116068018043e-08) * dVar1 + 1.6392004108230584e-06) * dVar1 +
             0.00018117679143520433) * dVar1 + 0.014741765091365868) * dVar1 + 0.6879595068317443;
    break;
  case 0x5c:
    dVar1 = y100 + y100 + -185.0;
    dVar1 = (((((dVar1 * 2.0803065333333334e-13 + 5.899112528756384e-11) * dVar1 +
               1.1732656736113608e-08) * dVar1 + 1.7307350969359975e-06) * dVar1 +
             0.00019128428784550924) * dVar1 + 0.015486504187117112) * dVar1 + 0.7181810380872997;
    break;
  case 0x5d:
    dVar1 = y100 + y100 + -187.0;
    dVar1 = (((((dVar1 * 2.1395783431111112e-13 + 6.152306831216908e-11) * dVar1 +
               1.2335161021630225e-08) * dVar1 + 1.8269894883203348e-06) * dVar1 +
             0.00020195505163377912) * dVar1 + 0.016272790364044783) * dVar1 + 0.7499332191172625;
    break;
  case 0x5e:
    dVar1 = y100 + y100 + -189.0;
    dVar1 = (((((dVar1 * 2.1986708942222223e-13 + 6.412604099806635e-11) * dVar1 +
               1.2963340087354342e-08) * dVar1 + 1.9281661395543912e-06) * dVar1 +
             0.00021321800585063328) * dVar1 + 0.01710293413265243) * dVar1 + 0.7833014353128349;
    break;
  case 0x5f:
    dVar1 = y100 + y100 + -191.0;
    dVar1 = (((((dVar1 * 2.257470126222222e-13 + 6.679976008397248e-11) * dVar1 +
               1.361790294183995e-08) * dVar1 + 2.0344732868018175e-06) * dVar1 +
             0.0002251033059275313) * dVar1 + 0.017979364149044223) * dVar1 + 0.8183758104102381;
    break;
  case 0x60:
    dVar1 = y100 + y100 + -193.0;
    dVar1 = (((((dVar1 * 2.3158593688888887e-13 + 6.954380386469418e-11) * dVar1 +
               1.4299555071870523e-08) * dVar1 + 2.146124825130639e-06) * dVar1 +
             0.00023764237370371255) * dVar1 + 0.01890463221254756) * dVar1 + 0.8552514477568512;
    break;
  case 0x61:
    dVar1 = y100 + y100 + -195.0;
    dVar1 = (((((dVar1 * 2.3737194737777777e-13 + 7.235760907504394e-11) * dVar1 +
               1.500899704211653e-08) * dVar1 + 2.2633402747585233e-06) * dVar1 +
             0.00025086793128395994) * dVar1 + 0.0198814183991272) * dVar1 + 0.8940286817084994;
    break;
  case 0x62:
    dVar1 = y100 + y100 + -197.0;
    dVar1 = (((((dVar1 * 2.4309291271111114e-13 + 7.524046814172015e-11) * dVar1 +
               1.5746923065472183e-08) * dVar1 + 2.3863447359754924e-06) * dVar1 +
             0.0002648140346599848) * dVar1 + 0.02091253632978037) * dVar1 + 0.9348133394287079;
    break;
  case 99:
    dVar1 = y100 + y100 + -199.0;
    dVar1 = (((((dVar1 * 2.4873652355555557e-13 + 7.819152682936823e-11) * dVar1 +
               1.651401954782282e-08) * dVar1 + 2.5153688325245316e-06) * dVar1 +
             0.0002795161070268238) * dVar1 + 0.02200093857283048) * dVar1 + 0.9777170133588503;
    break;
  default:
    return 1.0;
  }
  return dVar1;
}

Assistant:

GPU_FUNCTION static double erfcx_y100(double y100)
{
  switch ((int) y100) {
case 0: {
double t = 2*y100 - 1;
return 0.70878032454106438663e-3 + (0.71234091047026302958e-3 + (0.35779077297597742384e-5 + (0.17403143962587937815e-7 + (0.81710660047307788845e-10 + (0.36885022360434957634e-12 + 0.15917038551111111111e-14 * t) * t) * t) * t) * t) * t;
}
case 1: {
double t = 2*y100 - 3;
return 0.21479143208285144230e-2 + (0.72686402367379996033e-3 + (0.36843175430938995552e-5 + (0.18071841272149201685e-7 + (0.85496449296040325555e-10 + (0.38852037518534291510e-12 + 0.16868473576888888889e-14 * t) * t) * t) * t) * t) * t;
}
case 2: {
double t = 2*y100 - 5;
return 0.36165255935630175090e-2 + (0.74182092323555510862e-3 + (0.37948319957528242260e-5 + (0.18771627021793087350e-7 + (0.89484715122415089123e-10 + (0.40935858517772440862e-12 + 0.17872061464888888889e-14 * t) * t) * t) * t) * t) * t;
}
case 3: {
double t = 2*y100 - 7;
return 0.51154983860031979264e-2 + (0.75722840734791660540e-3 + (0.39096425726735703941e-5 + (0.19504168704300468210e-7 + (0.93687503063178993915e-10 + (0.43143925959079664747e-12 + 0.18939926435555555556e-14 * t) * t) * t) * t) * t) * t;
}
case 4: {
double t = 2*y100 - 9;
return 0.66457513172673049824e-2 + (0.77310406054447454920e-3 + (0.40289510589399439385e-5 + (0.20271233238288381092e-7 + (0.98117631321709100264e-10 + (0.45484207406017752971e-12 + 0.20076352213333333333e-14 * t) * t) * t) * t) * t) * t;
}
case 5: {
double t = 2*y100 - 11;
return 0.82082389970241207883e-2 + (0.78946629611881710721e-3 + (0.41529701552622656574e-5 + (0.21074693344544655714e-7 + (0.10278874108587317989e-9 + (0.47965201390613339638e-12 + 0.21285907413333333333e-14 * t) * t) * t) * t) * t) * t;
}
case 6: {
double t = 2*y100 - 13;
return 0.98039537275352193165e-2 + (0.80633440108342840956e-3 + (0.42819241329736982942e-5 + (0.21916534346907168612e-7 + (0.10771535136565470914e-9 + (0.50595972623692822410e-12 + 0.22573462684444444444e-14 * t) * t) * t) * t) * t) * t;
}
case 7: {
double t = 2*y100 - 15;
return 0.11433927298290302370e-1 + (0.82372858383196561209e-3 + (0.44160495311765438816e-5 + (0.22798861426211986056e-7 + (0.11291291745879239736e-9 + (0.53386189365816880454e-12 + 0.23944209546666666667e-14 * t) * t) * t) * t) * t) * t;
}
case 8: {
double t = 2*y100 - 17;
return 0.13099232878814653979e-1 + (0.84167002467906968214e-3 + (0.45555958988457506002e-5 + (0.23723907357214175198e-7 + (0.11839789326602695603e-9 + (0.56346163067550237877e-12 + 0.25403679644444444444e-14 * t) * t) * t) * t) * t) * t;
}
case 9: {
double t = 2*y100 - 19;
return 0.14800987015587535621e-1 + (0.86018092946345943214e-3 + (0.47008265848816866105e-5 + (0.24694040760197315333e-7 + (0.12418779768752299093e-9 + (0.59486890370320261949e-12 + 0.26957764568888888889e-14 * t) * t) * t) * t) * t) * t;
}
case 10: {
double t = 2*y100 - 21;
return 0.16540351739394069380e-1 + (0.87928458641241463952e-3 + (0.48520195793001753903e-5 + (0.25711774900881709176e-7 + (0.13030128534230822419e-9 + (0.62820097586874779402e-12 + 0.28612737351111111111e-14 * t) * t) * t) * t) * t) * t;
}
case 11: {
double t = 2*y100 - 23;
return 0.18318536789842392647e-1 + (0.89900542647891721692e-3 + (0.50094684089553365810e-5 + (0.26779777074218070482e-7 + (0.13675822186304615566e-9 + (0.66358287745352705725e-12 + 0.30375273884444444444e-14 * t) * t) * t) * t) * t) * t;
}
case 12: {
double t = 2*y100 - 25;
return 0.20136801964214276775e-1 + (0.91936908737673676012e-3 + (0.51734830914104276820e-5 + (0.27900878609710432673e-7 + (0.14357976402809042257e-9 + (0.70114790311043728387e-12 + 0.32252476000000000000e-14 * t) * t) * t) * t) * t) * t;
}
case 13: {
double t = 2*y100 - 27;
return 0.21996459598282740954e-1 + (0.94040248155366777784e-3 + (0.53443911508041164739e-5 + (0.29078085538049374673e-7 + (0.15078844500329731137e-9 + (0.74103813647499204269e-12 + 0.34251892320000000000e-14 * t) * t) * t) * t) * t) * t;
}
case 14: {
double t = 2*y100 - 29;
return 0.23898877187226319502e-1 + (0.96213386835900177540e-3 + (0.55225386998049012752e-5 + (0.30314589961047687059e-7 + (0.15840826497296335264e-9 + (0.78340500472414454395e-12 + 0.36381553564444444445e-14 * t) * t) * t) * t) * t) * t;
}
case 15: {
double t = 2*y100 - 31;
return 0.25845480155298518485e-1 + (0.98459293067820123389e-3 + (0.57082915920051843672e-5 + (0.31613782169164830118e-7 + (0.16646478745529630813e-9 + (0.82840985928785407942e-12 + 0.38649975768888888890e-14 * t) * t) * t) * t) * t) * t;
}
case 16: {
double t = 2*y100 - 33;
return 0.27837754783474696598e-1 + (0.10078108563256892757e-2 + (0.59020366493792212221e-5 + (0.32979263553246520417e-7 + (0.17498524159268458073e-9 + (0.87622459124842525110e-12 + 0.41066206488888888890e-14 * t) * t) * t) * t) * t) * t;
}
case 17: {
double t = 2*y100 - 35;
return 0.29877251304899307550e-1 + (0.10318204245057349310e-2 + (0.61041829697162055093e-5 + (0.34414860359542720579e-7 + (0.18399863072934089607e-9 + (0.92703227366365046533e-12 + 0.43639844053333333334e-14 * t) * t) * t) * t) * t) * t;
}
case 18: {
double t = 2*y100 - 37;
return 0.31965587178596443475e-1 + (0.10566560976716574401e-2 + (0.63151633192414586770e-5 + (0.35924638339521924242e-7 + (0.19353584758781174038e-9 + (0.98102783859889264382e-12 + 0.46381060817777777779e-14 * t) * t) * t) * t) * t) * t;
}
case 19: {
double t = 2*y100 - 39;
return 0.34104450552588334840e-1 + (0.10823541191350532574e-2 + (0.65354356159553934436e-5 + (0.37512918348533521149e-7 + (0.20362979635817883229e-9 + (0.10384187833037282363e-11 + 0.49300625262222222221e-14 * t) * t) * t) * t) * t) * t;
}
case 20: {
double t = 2*y100 - 41;
return 0.36295603928292425716e-1 + (0.11089526167995268200e-2 + (0.67654845095518363577e-5 + (0.39184292949913591646e-7 + (0.21431552202133775150e-9 + (0.10994259106646731797e-11 + 0.52409949102222222221e-14 * t) * t) * t) * t) * t) * t;
}
case 21: {
double t = 2*y100 - 43;
return 0.38540888038840509795e-1 + (0.11364917134175420009e-2 + (0.70058230641246312003e-5 + (0.40943644083718586939e-7 + (0.22563034723692881631e-9 + (0.11642841011361992885e-11 + 0.55721092871111111110e-14 * t) * t) * t) * t) * t) * t;
}
case 22: {
double t = 2*y100 - 45;
return 0.40842225954785960651e-1 + (0.11650136437945673891e-2 + (0.72569945502343006619e-5 + (0.42796161861855042273e-7 + (0.23761401711005024162e-9 + (0.12332431172381557035e-11 + 0.59246802364444444445e-14 * t) * t) * t) * t) * t) * t;
}
case 23: {
double t = 2*y100 - 47;
return 0.43201627431540222422e-1 + (0.11945628793917272199e-2 + (0.75195743532849206263e-5 + (0.44747364553960993492e-7 + (0.25030885216472953674e-9 + (0.13065684400300476484e-11 + 0.63000532853333333334e-14 * t) * t) * t) * t) * t) * t;
}
case 24: {
double t = 2*y100 - 49;
return 0.45621193513810471438e-1 + (0.12251862608067529503e-2 + (0.77941720055551920319e-5 + (0.46803119830954460212e-7 + (0.26375990983978426273e-9 + (0.13845421370977119765e-11 + 0.66996477404444444445e-14 * t) * t) * t) * t) * t) * t;
}
case 25: {
double t = 2*y100 - 51;
return 0.48103121413299865517e-1 + (0.12569331386432195113e-2 + (0.80814333496367673980e-5 + (0.48969667335682018324e-7 + (0.27801515481905748484e-9 + (0.14674637611609884208e-11 + 0.71249589351111111110e-14 * t) * t) * t) * t) * t) * t;
}
case 26: {
double t = 2*y100 - 53;
return 0.50649709676983338501e-1 + (0.12898555233099055810e-2 + (0.83820428414568799654e-5 + (0.51253642652551838659e-7 + (0.29312563849675507232e-9 + (0.15556512782814827846e-11 + 0.75775607822222222221e-14 * t) * t) * t) * t) * t) * t;
}
case 27: {
double t = 2*y100 - 55;
return 0.53263363664388864181e-1 + (0.13240082443256975769e-2 + (0.86967260015007658418e-5 + (0.53662102750396795566e-7 + (0.30914568786634796807e-9 + (0.16494420240828493176e-11 + 0.80591079644444444445e-14 * t) * t) * t) * t) * t) * t;
}
case 28: {
double t = 2*y100 - 57;
return 0.55946601353500013794e-1 + (0.13594491197408190706e-2 + (0.90262520233016380987e-5 + (0.56202552975056695376e-7 + (0.32613310410503135996e-9 + (0.17491936862246367398e-11 + 0.85713381688888888890e-14 * t) * t) * t) * t) * t) * t;
}
case 29: {
double t = 2*y100 - 59;
return 0.58702059496154081813e-1 + (0.13962391363223647892e-2 + (0.93714365487312784270e-5 + (0.58882975670265286526e-7 + (0.34414937110591753387e-9 + (0.18552853109751857859e-11 + 0.91160736711111111110e-14 * t) * t) * t) * t) * t) * t;
}
case 30: {
double t = 2*y100 - 61;
return 0.61532500145144778048e-1 + (0.14344426411912015247e-2 + (0.97331446201016809696e-5 + (0.61711860507347175097e-7 + (0.36325987418295300221e-9 + (0.19681183310134518232e-11 + 0.96952238400000000000e-14 * t) * t) * t) * t) * t) * t;
}
case 31: {
double t = 2*y100 - 63;
return 0.64440817576653297993e-1 + (0.14741275456383131151e-2 + (0.10112293819576437838e-4 + (0.64698236605933246196e-7 + (0.38353412915303665586e-9 + (0.20881176114385120186e-11 + 0.10310784480000000000e-13 * t) * t) * t) * t) * t) * t;
}
case 32: {
double t = 2*y100 - 65;
return 0.67430045633130393282e-1 + (0.15153655418916540370e-2 + (0.10509857606888328667e-4 + (0.67851706529363332855e-7 + (0.40504602194811140006e-9 + (0.22157325110542534469e-11 + 0.10964842115555555556e-13 * t) * t) * t) * t) * t) * t;
}
case 33: {
double t = 2*y100 - 67;
return 0.70503365513338850709e-1 + (0.15582323336495709827e-2 + (0.10926868866865231089e-4 + (0.71182482239613507542e-7 + (0.42787405890153386710e-9 + (0.23514379522274416437e-11 + 0.11659571751111111111e-13 * t) * t) * t) * t) * t) * t;
}
case 34: {
double t = 2*y100 - 69;
return 0.73664114037944596353e-1 + (0.16028078812438820413e-2 + (0.11364423678778207991e-4 + (0.74701423097423182009e-7 + (0.45210162777476488324e-9 + (0.24957355004088569134e-11 + 0.12397238257777777778e-13 * t) * t) * t) * t) * t) * t;
}
case 35: {
double t = 2*y100 - 71;
return 0.76915792420819562379e-1 + (0.16491766623447889354e-2 + (0.11823685320041302169e-4 + (0.78420075993781544386e-7 + (0.47781726956916478925e-9 + (0.26491544403815724749e-11 + 0.13180196462222222222e-13 * t) * t) * t) * t) * t) * t;
}
case 36: {
double t = 2*y100 - 73;
return 0.80262075578094612819e-1 + (0.16974279491709504117e-2 + (0.12305888517309891674e-4 + (0.82350717698979042290e-7 + (0.50511496109857113929e-9 + (0.28122528497626897696e-11 + 0.14010889635555555556e-13 * t) * t) * t) * t) * t) * t;
}
case 37: {
double t = 2*y100 - 75;
return 0.83706822008980357446e-1 + (0.17476561032212656962e-2 + (0.12812343958540763368e-4 + (0.86506399515036435592e-7 + (0.53409440823869467453e-9 + (0.29856186620887555043e-11 + 0.14891851591111111111e-13 * t) * t) * t) * t) * t) * t;
}
case 38: {
double t = 2*y100 - 77;
return 0.87254084284461718231e-1 + (0.17999608886001962327e-2 + (0.13344443080089492218e-4 + (0.90900994316429008631e-7 + (0.56486134972616465316e-9 + (0.31698707080033956934e-11 + 0.15825697795555555556e-13 * t) * t) * t) * t) * t) * t;
}
case 39: {
double t = 2*y100 - 79;
return 0.90908120182172748487e-1 + (0.18544478050657699758e-2 + (0.13903663143426120077e-4 + (0.95549246062549906177e-7 + (0.59752787125242054315e-9 + (0.33656597366099099413e-11 + 0.16815130613333333333e-13 * t) * t) * t) * t) * t) * t;
}
case 40: {
double t = 2*y100 - 81;
return 0.94673404508075481121e-1 + (0.19112284419887303347e-2 + (0.14491572616545004930e-4 + (0.10046682186333613697e-6 + (0.63221272959791000515e-9 + (0.35736693975589130818e-11 + 0.17862931591111111111e-13 * t) * t) * t) * t) * t) * t;
}
case 41: {
double t = 2*y100 - 83;
return 0.98554641648004456555e-1 + (0.19704208544725622126e-2 + (0.15109836875625443935e-4 + (0.10567036667675984067e-6 + (0.66904168640019354565e-9 + (0.37946171850824333014e-11 + 0.18971959040000000000e-13 * t) * t) * t) * t) * t) * t;
}
case 42: {
double t = 2*y100 - 85;
return 0.10255677889470089531e0 + (0.20321499629472857418e-2 + (0.15760224242962179564e-4 + (0.11117756071353507391e-6 + (0.70814785110097658502e-9 + (0.40292553276632563925e-11 + 0.20145143075555555556e-13 * t) * t) * t) * t) * t) * t;
}
case 43: {
double t = 2*y100 - 87;
return 0.10668502059865093318e0 + (0.20965479776148731610e-2 + (0.16444612377624983565e-4 + (0.11700717962026152749e-6 + (0.74967203250938418991e-9 + (0.42783716186085922176e-11 + 0.21385479360000000000e-13 * t) * t) * t) * t) * t) * t;
}
case 44: {
double t = 2*y100 - 89;
return 0.11094484319386444474e0 + (0.21637548491908170841e-2 + (0.17164995035719657111e-4 + (0.12317915750735938089e-6 + (0.79376309831499633734e-9 + (0.45427901763106353914e-11 + 0.22696025653333333333e-13 * t) * t) * t) * t) * t) * t;
}
case 45: {
double t = 2*y100 - 91;
return 0.11534201115268804714e0 + (0.22339187474546420375e-2 + (0.17923489217504226813e-4 + (0.12971465288245997681e-6 + (0.84057834180389073587e-9 + (0.48233721206418027227e-11 + 0.24079890062222222222e-13 * t) * t) * t) * t) * t) * t;
}
case 46: {
double t = 2*y100 - 93;
return 0.11988259392684094740e0 + (0.23071965691918689601e-2 + (0.18722342718958935446e-4 + (0.13663611754337957520e-6 + (0.89028385488493287005e-9 + (0.51210161569225846701e-11 + 0.25540227111111111111e-13 * t) * t) * t) * t) * t) * t;
}
case 47: {
double t = 2*y100 - 95;
return 0.12457298393509812907e0 + (0.23837544771809575380e-2 + (0.19563942105711612475e-4 + (0.14396736847739470782e-6 + (0.94305490646459247016e-9 + (0.54366590583134218096e-11 + 0.27080225920000000000e-13 * t) * t) * t) * t) * t) * t;
}
case 48: {
double t = 2*y100 - 97;
return 0.12941991566142438816e0 + (0.24637684719508859484e-2 + (0.20450821127475879816e-4 + (0.15173366280523906622e-6 + (0.99907632506389027739e-9 + (0.57712760311351625221e-11 + 0.28703099555555555556e-13 * t) * t) * t) * t) * t) * t;
}
case 49: {
double t = 2*y100 - 99;
return 0.13443048593088696613e0 + (0.25474249981080823877e-2 + (0.21385669591362915223e-4 + (0.15996177579900443030e-6 + (0.10585428844575134013e-8 + (0.61258809536787882989e-11 + 0.30412080142222222222e-13 * t) * t) * t) * t) * t) * t;
}
case 50: {
double t = 2*y100 - 101;
return 0.13961217543434561353e0 + (0.26349215871051761416e-2 + (0.22371342712572567744e-4 + (0.16868008199296822247e-6 + (0.11216596910444996246e-8 + (0.65015264753090890662e-11 + 0.32210394506666666666e-13 * t) * t) * t) * t) * t) * t;
}
case 51: {
double t = 2*y100 - 103;
return 0.14497287157673800690e0 + (0.27264675383982439814e-2 + (0.23410870961050950197e-4 + (0.17791863939526376477e-6 + (0.11886425714330958106e-8 + (0.68993039665054288034e-11 + 0.34101266222222222221e-13 * t) * t) * t) * t) * t) * t;
}
case 52: {
double t = 2*y100 - 105;
return 0.15052089272774618151e0 + (0.28222846410136238008e-2 + (0.24507470422713397006e-4 + (0.18770927679626136909e-6 + (0.12597184587583370712e-8 + (0.73203433049229821618e-11 + 0.36087889048888888890e-13 * t) * t) * t) * t) * t) * t;
}
case 53: {
double t = 2*y100 - 107;
return 0.15626501395774612325e0 + (0.29226079376196624949e-2 + (0.25664553693768450545e-4 + (0.19808568415654461964e-6 + (0.13351257759815557897e-8 + (0.77658124891046760667e-11 + 0.38173420035555555555e-13 * t) * t) * t) * t) * t) * t;
}
case 54: {
double t = 2*y100 - 109;
return 0.16221449434620737567e0 + (0.30276865332726475672e-2 + (0.26885741326534564336e-4 + (0.20908350604346384143e-6 + (0.14151148144240728728e-8 + (0.82369170665974313027e-11 + 0.40360957457777777779e-13 * t) * t) * t) * t) * t) * t;
}
case 55: {
double t = 2*y100 - 111;
return 0.16837910595412130659e0 + (0.31377844510793082301e-2 + (0.28174873844911175026e-4 + (0.22074043807045782387e-6 + (0.14999481055996090039e-8 + (0.87348993661930809254e-11 + 0.42653528977777777779e-13 * t) * t) * t) * t) * t) * t;
}
case 56: {
double t = 2*y100 - 113;
return 0.17476916455659369953e0 + (0.32531815370903068316e-2 + (0.29536024347344364074e-4 + (0.23309632627767074202e-6 + (0.15899007843582444846e-8 + (0.92610375235427359475e-11 + 0.45054073102222222221e-13 * t) * t) * t) * t) * t) * t;
}
case 57: {
double t = 2*y100 - 115;
return 0.18139556223643701364e0 + (0.33741744168096996041e-2 + (0.30973511714709500836e-4 + (0.24619326937592290996e-6 + (0.16852609412267750744e-8 + (0.98166442942854895573e-11 + 0.47565418097777777779e-13 * t) * t) * t) * t) * t) * t;
}
case 58: {
double t = 2*y100 - 117;
return 0.18826980194443664549e0 + (0.35010775057740317997e-2 + (0.32491914440014267480e-4 + (0.26007572375886319028e-6 + (0.17863299617388376116e-8 + (0.10403065638343878679e-10 + 0.50190265831111111110e-13 * t) * t) * t) * t) * t) * t;
}
case 59: {
double t = 2*y100 - 119;
return 0.19540403413693967350e0 + (0.36342240767211326315e-2 + (0.34096085096200907289e-4 + (0.27479061117017637474e-6 + (0.18934228504790032826e-8 + (0.11021679075323598664e-10 + 0.52931171733333333334e-13 * t) * t) * t) * t) * t) * t;
}
case 60: {
double t = 2*y100 - 121;
return 0.20281109560651886959e0 + (0.37739673859323597060e-2 + (0.35791165457592409054e-4 + (0.29038742889416172404e-6 + (0.20068685374849001770e-8 + (0.11673891799578381999e-10 + 0.55790523093333333334e-13 * t) * t) * t) * t) * t) * t;
}
case 61: {
double t = 2*y100 - 123;
return 0.21050455062669334978e0 + (0.39206818613925652425e-2 + (0.37582602289680101704e-4 + (0.30691836231886877385e-6 + (0.21270101645763677824e-8 + (0.12361138551062899455e-10 + 0.58770520160000000000e-13 * t) * t) * t) * t) * t) * t;
}
case 62: {
double t = 2*y100 - 125;
return 0.21849873453703332479e0 + (0.40747643554689586041e-2 + (0.39476163820986711501e-4 + (0.32443839970139918836e-6 + (0.22542053491518680200e-8 + (0.13084879235290858490e-10 + 0.61873153262222222221e-13 * t) * t) * t) * t) * t) * t;
}
case 63: {
double t = 2*y100 - 127;
return 0.22680879990043229327e0 + (0.42366354648628516935e-2 + (0.41477956909656896779e-4 + (0.34300544894502810002e-6 + (0.23888264229264067658e-8 + (0.13846596292818514601e-10 + 0.65100183751111111110e-13 * t) * t) * t) * t) * t) * t;
}
case 64: {
double t = 2*y100 - 129;
return 0.23545076536988703937e0 + (0.44067409206365170888e-2 + (0.43594444916224700881e-4 + (0.36268045617760415178e-6 + (0.25312606430853202748e-8 + (0.14647791812837903061e-10 + 0.68453122631111111110e-13 * t) * t) * t) * t) * t) * t;
}
case 65: {
double t = 2*y100 - 131;
return 0.24444156740777432838e0 + (0.45855530511605787178e-2 + (0.45832466292683085475e-4 + (0.38352752590033030472e-6 + (0.26819103733055603460e-8 + (0.15489984390884756993e-10 + 0.71933206364444444445e-13 * t) * t) * t) * t) * t) * t;
}
case 66: {
double t = 2*y100 - 133;
return 0.25379911500634264643e0 + (0.47735723208650032167e-2 + (0.48199253896534185372e-4 + (0.40561404245564732314e-6 + (0.28411932320871165585e-8 + (0.16374705736458320149e-10 + 0.75541379822222222221e-13 * t) * t) * t) * t) * t) * t;
}
case 67: {
double t = 2*y100 - 135;
return 0.26354234756393613032e0 + (0.49713289477083781266e-2 + (0.50702455036930367504e-4 + (0.42901079254268185722e-6 + (0.30095422058900481753e-8 + (0.17303497025347342498e-10 + 0.79278273368888888890e-13 * t) * t) * t) * t) * t) * t;
}
case 68: {
double t = 2*y100 - 137;
return 0.27369129607732343398e0 + (0.51793846023052643767e-2 + (0.53350152258326602629e-4 + (0.45379208848865015485e-6 + (0.31874057245814381257e-8 + (0.18277905010245111046e-10 + 0.83144182364444444445e-13 * t) * t) * t) * t) * t) * t;
}
case 69: {
double t = 2*y100 - 139;
return 0.28426714781640316172e0 + (0.53983341916695141966e-2 + (0.56150884865255810638e-4 + (0.48003589196494734238e-6 + (0.33752476967570796349e-8 + (0.19299477888083469086e-10 + 0.87139049137777777779e-13 * t) * t) * t) * t) * t) * t;
}
case 70: {
double t = 2*y100 - 141;
return 0.29529231465348519920e0 + (0.56288077305420795663e-2 + (0.59113671189913307427e-4 + (0.50782393781744840482e-6 + (0.35735475025851713168e-8 + (0.20369760937017070382e-10 + 0.91262442613333333334e-13 * t) * t) * t) * t) * t) * t;
}
case 71: {
double t = 2*y100 - 143;
return 0.30679050522528838613e0 + (0.58714723032745403331e-2 + (0.62248031602197686791e-4 + (0.53724185766200945789e-6 + (0.37827999418960232678e-8 + (0.21490291930444538307e-10 + 0.95513539182222222221e-13 * t) * t) * t) * t) * t) * t;
}
case 72: {
double t = 2*y100 - 145;
return 0.31878680111173319425e0 + (0.61270341192339103514e-2 + (0.65564012259707640976e-4 + (0.56837930287837738996e-6 + (0.40035151353392378882e-8 + (0.22662596341239294792e-10 + 0.99891109760000000000e-13 * t) * t) * t) * t) * t) * t;
}
case 73: {
double t = 2*y100 - 147;
return 0.33130773722152622027e0 + (0.63962406646798080903e-2 + (0.69072209592942396666e-4 + (0.60133006661885941812e-6 + (0.42362183765883466691e-8 + (0.23888182347073698382e-10 + 0.10439349811555555556e-12 * t) * t) * t) * t) * t) * t;
}
case 74: {
double t = 2*y100 - 149;
return 0.34438138658041336523e0 + (0.66798829540414007258e-2 + (0.72783795518603561144e-4 + (0.63619220443228800680e-6 + (0.44814499336514453364e-8 + (0.25168535651285475274e-10 + 0.10901861383111111111e-12 * t) * t) * t) * t) * t) * t;
}
case 75: {
double t = 2*y100 - 151;
return 0.35803744972380175583e0 + (0.69787978834882685031e-2 + (0.76710543371454822497e-4 + (0.67306815308917386747e-6 + (0.47397647975845228205e-8 + (0.26505114141143050509e-10 + 0.11376390933333333333e-12 * t) * t) * t) * t) * t) * t;
}
case 76: {
double t = 2*y100 - 153;
return 0.37230734890119724188e0 + (0.72938706896461381003e-2 + (0.80864854542670714092e-4 + (0.71206484718062688779e-6 + (0.50117323769745883805e-8 + (0.27899342394100074165e-10 + 0.11862637614222222222e-12 * t) * t) * t) * t) * t) * t;
}
case 77: {
double t = 2*y100 - 155;
return 0.38722432730555448223e0 + (0.76260375162549802745e-2 + (0.85259785810004603848e-4 + (0.75329383305171327677e-6 + (0.52979361368388119355e-8 + (0.29352606054164086709e-10 + 0.12360253370666666667e-12 * t) * t) * t) * t) * t) * t;
}
case 78: {
double t = 2*y100 - 157;
return 0.40282355354616940667e0 + (0.79762880915029728079e-2 + (0.89909077342438246452e-4 + (0.79687137961956194579e-6 + (0.55989731807360403195e-8 + (0.30866246101464869050e-10 + 0.12868841946666666667e-12 * t) * t) * t) * t) * t) * t;
}
case 79: {
double t = 2*y100 - 159;
return 0.41914223158913787649e0 + (0.83456685186950463538e-2 + (0.94827181359250161335e-4 + (0.84291858561783141014e-6 + (0.59154537751083485684e-8 + (0.32441553034347469291e-10 + 0.13387957943111111111e-12 * t) * t) * t) * t) * t) * t;
}
case 80: {
double t = 2*y100 - 161;
return 0.43621971639463786896e0 + (0.87352841828289495773e-2 + (0.10002929142066799966e-3 + (0.89156148280219880024e-6 + (0.62480008150788597147e-8 + (0.34079760983458878910e-10 + 0.13917107176888888889e-12 * t) * t) * t) * t) * t) * t;
}
case 81: {
double t = 2*y100 - 163;
return 0.45409763548534330981e0 + (0.91463027755548240654e-2 + (0.10553137232446167258e-3 + (0.94293113464638623798e-6 + (0.65972492312219959885e-8 + (0.35782041795476563662e-10 + 0.14455745872000000000e-12 * t) * t) * t) * t) * t) * t;
}
case 82: {
double t = 2*y100 - 165;
return 0.47282001668512331468e0 + (0.95799574408860463394e-2 + (0.11135019058000067469e-3 + (0.99716373005509038080e-6 + (0.69638453369956970347e-8 + (0.37549499088161345850e-10 + 0.15003280712888888889e-12 * t) * t) * t) * t) * t) * t;
}
case 83: {
double t = 2*y100 - 167;
return 0.49243342227179841649e0 + (0.10037550043909497071e-1 + (0.11750334542845234952e-3 + (0.10544006716188967172e-5 + (0.73484461168242224872e-8 + (0.39383162326435752965e-10 + 0.15559069118222222222e-12 * t) * t) * t) * t) * t) * t;
}
case 84: {
double t = 2*y100 - 169;
return 0.51298708979209258326e0 + (0.10520454564612427224e-1 + (0.12400930037494996655e-3 + (0.11147886579371265246e-5 + (0.77517184550568711454e-8 + (0.41283980931872622611e-10 + 0.16122419680000000000e-12 * t) * t) * t) * t) * t) * t;
}
case 85: {
double t = 2*y100 - 171;
return 0.53453307979101369843e0 + (0.11030120618800726938e-1 + (0.13088741519572269581e-3 + (0.11784797595374515432e-5 + (0.81743383063044825400e-8 + (0.43252818449517081051e-10 + 0.16692592640000000000e-12 * t) * t) * t) * t) * t) * t;
}
case 86: {
double t = 2*y100 - 173;
return 0.55712643071169299478e0 + (0.11568077107929735233e-1 + (0.13815797838036651289e-3 + (0.12456314879260904558e-5 + (0.86169898078969313597e-8 + (0.45290446811539652525e-10 + 0.17268801084444444444e-12 * t) * t) * t) * t) * t) * t;
}
case 87: {
double t = 2*y100 - 175;
return 0.58082532122519320968e0 + (0.12135935999503877077e-1 + (0.14584223996665838559e-3 + (0.13164068573095710742e-5 + (0.90803643355106020163e-8 + (0.47397540713124619155e-10 + 0.17850211608888888889e-12 * t) * t) * t) * t) * t) * t;
}
case 88: {
double t = 2*y100 - 177;
return 0.60569124025293375554e0 + (0.12735396239525550361e-1 + (0.15396244472258863344e-3 + (0.13909744385382818253e-5 + (0.95651595032306228245e-8 + (0.49574672127669041550e-10 + 0.18435945564444444444e-12 * t) * t) * t) * t) * t) * t;
}
case 89: {
double t = 2*y100 - 179;
return 0.63178916494715716894e0 + (0.13368247798287030927e-1 + (0.16254186562762076141e-3 + (0.14695084048334056083e-5 + (0.10072078109604152350e-7 + (0.51822304995680707483e-10 + 0.19025081422222222222e-12 * t) * t) * t) * t) * t) * t;
}
case 90: {
double t = 2*y100 - 181;
return 0.65918774689725319200e0 + (0.14036375850601992063e-1 + (0.17160483760259706354e-3 + (0.15521885688723188371e-5 + (0.10601827031535280590e-7 + (0.54140790105837520499e-10 + 0.19616655146666666667e-12 * t) * t) * t) * t) * t) * t;
}
case 91: {
double t = 2*y100 - 183;
return 0.68795950683174433822e0 + (0.14741765091365869084e-1 + (0.18117679143520433835e-3 + (0.16392004108230585213e-5 + (0.11155116068018043001e-7 + (0.56530360194925690374e-10 + 0.20209663662222222222e-12 * t) * t) * t) * t) * t) * t;
}
case 92: {
double t = 2*y100 - 185;
return 0.71818103808729967036e0 + (0.15486504187117112279e-1 + (0.19128428784550923217e-3 + (0.17307350969359975848e-5 + (0.11732656736113607751e-7 + (0.58991125287563833603e-10 + 0.20803065333333333333e-12 * t) * t) * t) * t) * t) * t;
}
case 93: {
double t = 2*y100 - 187;
return 0.74993321911726254661e0 + (0.16272790364044783382e-1 + (0.20195505163377912645e-3 + (0.18269894883203346953e-5 + (0.12335161021630225535e-7 + (0.61523068312169087227e-10 + 0.21395783431111111111e-12 * t) * t) * t) * t) * t) * t;
}
case 94: {
double t = 2*y100 - 189;
return 0.78330143531283492729e0 + (0.17102934132652429240e-1 + (0.21321800585063327041e-3 + (0.19281661395543913713e-5 + (0.12963340087354341574e-7 + (0.64126040998066348872e-10 + 0.21986708942222222222e-12 * t) * t) * t) * t) * t) * t;
}
case 95: {
double t = 2*y100 - 191;
return 0.81837581041023811832e0 + (0.17979364149044223802e-1 + (0.22510330592753129006e-3 + (0.20344732868018175389e-5 + (0.13617902941839949718e-7 + (0.66799760083972474642e-10 + 0.22574701262222222222e-12 * t) * t) * t) * t) * t) * t;
}
case 96: {
double t = 2*y100 - 193;
return 0.85525144775685126237e0 + (0.18904632212547561026e-1 + (0.23764237370371255638e-3 + (0.21461248251306387979e-5 + (0.14299555071870523786e-7 + (0.69543803864694171934e-10 + 0.23158593688888888889e-12 * t) * t) * t) * t) * t) * t;
}
case 97: {
double t = 2*y100 - 195;
return 0.89402868170849933734e0 + (0.19881418399127202569e-1 + (0.25086793128395995798e-3 + (0.22633402747585233180e-5 + (0.15008997042116532283e-7 + (0.72357609075043941261e-10 + 0.23737194737777777778e-12 * t) * t) * t) * t) * t) * t;
}
case 98: {
double t = 2*y100 - 197;
return 0.93481333942870796363e0 + (0.20912536329780368893e-1 + (0.26481403465998477969e-3 + (0.23863447359754921676e-5 + (0.15746923065472184451e-7 + (0.75240468141720143653e-10 + 0.24309291271111111111e-12 * t) * t) * t) * t) * t) * t;
}
case 99: {
double t = 2*y100 - 199;
return 0.97771701335885035464e0 + (0.22000938572830479551e-1 + (0.27951610702682383001e-3 + (0.25153688325245314530e-5 + (0.16514019547822821453e-7 + (0.78191526829368231251e-10 + 0.24873652355555555556e-12 * t) * t) * t) * t) * t) * t;
}
  }
  // we only get here if y = 1, i.e. |x| < 4*eps, in which case
  // erfcx is within 1e-15 of 1..
  return 1.0;
}